

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_functions.cc
# Opt level: O0

uint32_t hash_shuffle_2uint(uint64_t a,uint64_t b)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint32_t c;
  uint64_t b_local;
  uint64_t a_local;
  
  uVar3 = ((a ^ 0xffffffffffffffff) >> 0x38 | ((a ^ 0xffffffffffffffff) & 0xff000000000000) >> 0x28
           | ((a ^ 0xffffffffffffffff) & 0xff0000000000) >> 0x18 |
           ((a ^ 0xffffffffffffffff) & 0xff00000000) >> 8 |
           ((a ^ 0xffffffffffffffff) & 0xff000000) << 8 |
           ((a ^ 0xffffffffffffffff) & 0xff0000) << 0x18 |
           ((a ^ 0xffffffffffffffff) & 0xff00) << 0x28 | (a ^ 0xffffffffffffffff) << 0x38) ^ a;
  uVar4 = ((b ^ 0xffffffffffffffff) >> 0x38 | ((b ^ 0xffffffffffffffff) & 0xff000000000000) >> 0x28
           | ((b ^ 0xffffffffffffffff) & 0xff0000000000) >> 0x18 |
           ((b ^ 0xffffffffffffffff) & 0xff00000000) >> 8 |
           ((b ^ 0xffffffffffffffff) & 0xff000000) << 8 |
           ((b ^ 0xffffffffffffffff) & 0xff0000) << 0x18 |
           ((b ^ 0xffffffffffffffff) & 0xff00) << 0x28 | (b ^ 0xffffffffffffffff) << 0x38) ^ b;
  uVar3 = uVar3 & 0xffff ^ (uVar3 & 0xffff0000) >> 0x10 ^ (uVar3 & 0xffff00000000) >> 0x20 ^
          uVar3 >> 0x30;
  uVar4 = uVar4 & 0xffff ^ (uVar4 & 0xffff0000) >> 0x10 ^ (uVar4 & 0xffff00000000) >> 0x20 ^
          uVar4 >> 0x30;
  uVar2 = (uint)uVar3 & 0xf | (uint)((uVar4 & 0xf) << 4) | (uint)((uVar3 & 0xf0) << 4) |
          (uint)((uVar4 & 0xf0) << 8) | (uint)((uVar3 & 0xf00) << 8) |
          (uint)((uVar4 & 0xf00) << 0xc);
  uVar1 = uVar2 | (uint)((uVar3 & 0xf000) << 0xc);
  return uVar2 * 0x400 + uVar1 * 0x20 + (uVar1 | (uint)((uVar4 & 0xf000) << 0x10));
}

Assistant:

uint32_t hash_shuffle_2uint(uint64_t a, uint64_t b)
{
    uint32_t c;

    a ^= bitswap64(a ^ UINT64_C(0xffffffffffffffff));
    b ^= bitswap64(b ^ UINT64_C(0xffffffffffffffff));

    a = (a & 0xffff) ^ ((a & 0xffff0000) >> 16) ^
        ((a & UINT64_C(0xffff00000000)) >> 32) ^
        ((a & UINT64_C(0xffff000000000000)) >> 48);
    b = (b & 0xffff) ^ ((b & 0xffff0000) >> 16) ^
        ((b & UINT64_C(0xffff00000000)) >> 32) ^
        ((b & UINT64_C(0xffff000000000000)) >> 48);

    c = (((a & 0x0000000f) << 0) |
        ((b & 0x0000000f) << 4) |
        ((a & 0x000000f0) << 4) |
        ((b & 0x000000f0) << 8) |
        ((a & 0x00000f00) << 8) |
        ((b & 0x00000f00) << 12) |
        ((a & 0x0000f000) << 12) |
        ((b & 0x0000f000) << 16));

    return (((c << 5) + c) << 5) + c;
}